

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O2

void cmXMLParserStartElement(void *parser,char *name,char **atts)

{
  allocator<char> local_39;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,name,&local_39);
  (**(code **)(*parser + 0x40))(parser,local_38,atts);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmXMLParserStartElement(void* parser, const char* name, const char** atts)
{
  // Begin element handler that is registered with the XML_Parser.
  // This just casts the user data to a cmXMLParser and calls
  // StartElement.
  static_cast<cmXMLParser*>(parser)->StartElement(name, atts);
}